

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void mir::inst::display_op(ostream *o,Op val)

{
  char *pcVar1;
  
  switch(val) {
  case Add:
    pcVar1 = "+";
    break;
  case Sub:
    pcVar1 = "-";
    break;
  case Mul:
    pcVar1 = "*";
    break;
  case Div:
    pcVar1 = "/";
    break;
  case MulSh:
    std::__ostream_insert<char,std::char_traits<char>>(o,"MulSh",5);
    return;
  case Rem:
    pcVar1 = "%";
    break;
  case Gt:
    pcVar1 = ">";
    break;
  case Lt:
    pcVar1 = "<";
    break;
  case Gte:
    pcVar1 = ">=";
    goto LAB_001b0684;
  case Lte:
    pcVar1 = "<=";
    goto LAB_001b0684;
  case Eq:
    pcVar1 = "==";
    goto LAB_001b0684;
  case Neq:
    pcVar1 = "!=";
    goto LAB_001b0684;
  case And:
    pcVar1 = "&";
    break;
  case Or:
    pcVar1 = "|";
    break;
  case Xor:
    pcVar1 = "^";
    break;
  case Not:
    pcVar1 = "!";
    break;
  case Shl:
    pcVar1 = "<<";
    goto LAB_001b0684;
  case Shr:
    std::__ostream_insert<char,std::char_traits<char>>(o,">>>",3);
    return;
  case ShrA:
    pcVar1 = ">>";
LAB_001b0684:
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar1,2);
    return;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar1,1);
  return;
}

Assistant:

void display_op(std::ostream& o, Op val) {
  switch (val) {
    case Op::Add:
      o << "+";
      break;
    case Op::Sub:
      o << "-";
      break;
    case Op::Mul:
      o << "*";
      break;
    case Op::MulSh:
      o << "MulSh";
      break;
    case Op::Div:
      o << "/";
      break;
    case Op::Rem:
      o << "%";
      break;
    case Op::Gt:
      o << ">";
      break;
    case Op::Lt:
      o << "<";
      break;
    case Op::Gte:
      o << ">=";
      break;
    case Op::Lte:
      o << "<=";
      break;
    case Op::Eq:
      o << "==";
      break;
    case Op::Neq:
      o << "!=";
      break;
    case Op::And:
      o << "&";
      break;
    case Op::Or:
      o << "|";
      break;
    case Op::Xor:
      o << "^";
      break;
    case Op::Not:
      o << "!";
      break;
    case Op::Shl:
      o << "<<";
      break;
    case Op::Shr:
      o << ">>>";
      break;
    case Op::ShrA:
      o << ">>";
      break;
  }
}